

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

Bool IsValidSrcExtension(ctmbstr sType)

{
  Bool BVar1;
  int iVar2;
  uint maxExt;
  long lVar3;
  tmbchar ext [20];
  tmbchar atStack_38 [32];
  
  BVar1 = IsFilePath(sType);
  if (BVar1 != no) {
    GetFileExtension(sType,atStack_38,maxExt);
    lVar3 = 0;
    do {
      iVar2 = prvTidytmbstrcasecmp
                        (atStack_38,
                         (ctmbstr)((long)&frameExtensions_rel +
                                  (long)*(int *)((long)&frameExtensions_rel + lVar3)));
      if (iVar2 == 0) {
        return yes;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x28);
  }
  return no;
}

Assistant:

static Bool IsValidSrcExtension( ctmbstr sType )
{
    uint i;
    tmbchar ext[20];
    
    if ( !IsFilePath(sType) ) return 0;
    
    GetFileExtension( sType, ext, sizeof(ext) );

    for (i = 0; i < N_FRAME_EXTS; i++)
    {
        if ( TY_(tmbstrcasecmp)(ext, frameExtensions[i]) == 0 )
            return yes;
    }
    return no;
}